

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  uchar *puVar1;
  uint uVar2;
  stbtt_uint32 sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  stbtt__buf operands;
  stbtt__buf local_40;
  
  uVar2 = b->size;
  uVar6 = 0;
  if ((int)uVar2 < 0) {
    uVar6 = uVar2;
  }
  b->cursor = uVar6;
  if ((int)uVar2 < 1) {
    return;
  }
  do {
    uVar9 = 0;
    if ((int)uVar6 < (int)uVar2) {
      uVar5 = (ulong)uVar6;
      do {
        puVar1 = b->data;
        uVar4 = (uint)uVar5;
        lVar7 = (long)(int)uVar4;
        if (puVar1[lVar7] < 0x1c) {
          uVar8 = lVar7 + 1;
          b->cursor = (int)uVar8;
          uVar9 = (uint)puVar1[lVar7];
          if ((puVar1[lVar7] == 0xc) && (uVar9 = 0x100, (int)uVar8 < (int)uVar2)) {
            b->cursor = uVar4 + 2;
            uVar9 = puVar1[uVar8] | 0x100;
            uVar8 = (ulong)(uVar4 + 2);
          }
          goto LAB_00137d63;
        }
        if (puVar1[lVar7] == 0x1e) {
          uVar9 = uVar4 + 1;
          if ((int)uVar4 < -1) {
            uVar9 = uVar2;
          }
          uVar5 = (ulong)uVar9;
          b->cursor = uVar9;
          uVar4 = uVar2;
          if ((int)uVar2 < (int)uVar9) {
            uVar4 = uVar9;
          }
          if ((int)uVar9 < (int)uVar2) {
            uVar8 = (long)(int)uVar9;
            do {
              uVar5 = uVar8 + 1;
              b->cursor = (int)uVar8 + 1;
              if (((~puVar1[uVar8] & 0xf) == 0) || ((puVar1[uVar8] & 0xf0) == 0xf0)) break;
              bVar10 = (long)(int)uVar4 - 1U != uVar8;
              uVar8 = uVar5;
            } while (bVar10);
          }
        }
        else {
          stbtt__cff_int(b);
          uVar5 = (ulong)(uint)b->cursor;
          uVar2 = b->size;
        }
      } while ((int)(uint)uVar5 < (int)uVar2);
      uVar8 = uVar5 & 0xffffffff;
      uVar9 = 0;
      uVar4 = (uint)uVar5;
    }
    else {
      uVar8 = (ulong)uVar6;
      uVar4 = uVar6;
    }
LAB_00137d63:
    if (uVar9 == key) {
      if ((int)(uVar4 - uVar6 | uVar6) < 0) {
        return;
      }
      if ((int)uVar2 < (int)uVar6) {
        return;
      }
      if ((int)uVar2 < (int)uVar4) {
        return;
      }
      local_40.data = b->data + uVar6;
      local_40._8_8_ = (ulong)(uVar4 - uVar6) << 0x20;
      if (outcount < 1) {
        return;
      }
      if (uVar4 == uVar6) {
        return;
      }
      uVar8 = 1;
      do {
        sVar3 = stbtt__cff_int(&local_40);
        out[uVar8 - 1] = sVar3;
        if ((uint)outcount <= uVar8) {
          return;
        }
        uVar8 = uVar8 + 1;
      } while (local_40.cursor < local_40.size);
      return;
    }
    uVar6 = (uint)uVar8;
    if ((int)uVar2 <= (int)uVar6) {
      return;
    }
  } while( true );
}

Assistant:

static void stbtt__buf_seek(stbtt__buf *b, int o)
{
   STBTT_assert(!(o > b->size || o < 0));
   b->cursor = (o > b->size || o < 0) ? b->size : o;
}